

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,_QHashDummyValue>::emplace<QHashDummyValue>
          (QHash<QString,_QHashDummyValue> *this,QString *key,QHashDummyValue *args)

{
  long lVar1;
  bool bVar2;
  QString *in_RDX;
  QHash<QString,_QHashDummyValue> *in_RSI;
  QHashDummyValue *in_RDI;
  long in_FS_OFFSET;
  iterator iVar3;
  QHash<QString,_QHashDummyValue> copy;
  QHash<QString,_QHashDummyValue> *in_stack_ffffffffffffffa8;
  QHash<QString,_QHashDummyValue> *in_stack_ffffffffffffffb0;
  undefined1 local_28 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isDetached(in_stack_ffffffffffffffb0);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::shouldGrow
                      (*(Data<QHashPrivate::Node<QString,_QHashDummyValue>_> **)in_RDI);
    if (bVar2) {
      local_28 = (undefined1  [16])emplace_helper<QHashDummyValue>(in_RSI,in_RDX,in_RDI);
    }
    else {
      local_28 = (undefined1  [16])emplace_helper<QHashDummyValue>(in_RSI,in_RDX,in_RDI);
    }
  }
  else {
    QHash(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    detach(in_stack_ffffffffffffffb0);
    local_28 = (undefined1  [16])emplace_helper<QHashDummyValue>(in_RSI,in_RDX,in_RDI);
    ~QHash(in_stack_ffffffffffffffb0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    iVar3.i.d = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)local_28._0_8_;
    iVar3.i.bucket = local_28._8_8_;
    return (iterator)iVar3.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }